

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O2

void __thiscall skiwi::skiwi_parameters::skiwi_parameters(skiwi_parameters *this)

{
  this->heap_size = 0x200000;
  this->globals_stack = 0x10000;
  this->local_stack = 0x100;
  this->scheme_stack = 0x1000;
  this->trace = (ostream *)&std::cout;
  this->stderror = (ostream *)&std::cout;
  this->stdoutput = (ostream *)&std::cout;
  return;
}

Assistant:

skiwi_parameters::skiwi_parameters()
  {
  heap_size = 2 * 1024 * 1024;
  globals_stack = 64 * 1024;
  local_stack = 256;
  scheme_stack = 4096;
  trace = &std::cout;
  stderror = &std::cout;
  stdoutput = &std::cout;
  }